

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_formatter.cpp
# Opt level: O1

string * lwlog::details::alignment_formatter::align_right
                   (string *__return_storage_ptr__,string *to_align,uint8_t width,char fill_char)

{
  ulong uVar1;
  pointer pcVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000011,width) & 0xffffffff;
  uVar1 = to_align->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (uVar1 < uVar3) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
               (char)uVar3 - (char)to_align->_M_string_length);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(to_align->_M_dataplus)._M_p);
  }
  else {
    pcVar2 = (to_align->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1,
               CONCAT71(in_register_00000009,fill_char));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string alignment_formatter::align_right(const std::string& to_align, std::uint8_t width, char fill_char)
	{
		if (width <= to_align.size()) return to_align;

		std::string result;
		result.reserve(width);

		result.append(width - to_align.size(), fill_char);
		result.append(to_align);

		return result;
	}